

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

void __thiscall llvm::yaml::Input::scalarString(Input *this,StringRef *S,QuotingType param_2)

{
  HNode *hnode;
  size_t sVar1;
  ret_type pSVar2;
  Twine local_38;
  
  pSVar2 = dyn_cast<llvm::yaml::Input::ScalarHNode,llvm::yaml::Input::HNode>(this->CurrentNode);
  if (pSVar2 == (ret_type)0x0) {
    hnode = this->CurrentNode;
    Twine::Twine(&local_38,"unexpected scalar");
    setError(this,hnode,&local_38);
  }
  else {
    sVar1 = (pSVar2->_value).Length;
    S->Data = (pSVar2->_value).Data;
    S->Length = sVar1;
  }
  return;
}

Assistant:

void Input::scalarString(StringRef &S, QuotingType) {
  if (ScalarHNode *SN = dyn_cast<ScalarHNode>(CurrentNode)) {
    S = SN->value();
  } else {
    setError(CurrentNode, "unexpected scalar");
  }
}